

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_send_server_certificate_verify(SSL_HANDSHAKE *hs)

{
  ssl_private_key_result_t sVar1;
  SSL_HANDSHAKE *hs_local;
  
  sVar1 = tls13_add_certificate_verify(hs);
  if (sVar1 == ssl_private_key_success) {
    hs->tls13_state = 6;
    hs_local._4_4_ = ssl_hs_ok;
  }
  else if (sVar1 == ssl_private_key_retry) {
    hs->tls13_state = 5;
    hs_local._4_4_ = ssl_hs_private_key_operation;
  }
  else {
    if (sVar1 != ssl_private_key_failure) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                    ,0x41c,
                    "enum ssl_hs_wait_t bssl::do_send_server_certificate_verify(SSL_HANDSHAKE *)");
    }
    hs_local._4_4_ = ssl_hs_error;
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_send_server_certificate_verify(SSL_HANDSHAKE *hs) {
  switch (tls13_add_certificate_verify(hs)) {
    case ssl_private_key_success:
      hs->tls13_state = state13_send_server_finished;
      return ssl_hs_ok;

    case ssl_private_key_retry:
      hs->tls13_state = state13_send_server_certificate_verify;
      return ssl_hs_private_key_operation;

    case ssl_private_key_failure:
      return ssl_hs_error;
  }

  assert(0);
  return ssl_hs_error;
}